

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

void If_Dec7MinimumBase(word *uTruth,int *pSupp,int nVarsAll,int *pnVars)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  word *pwVar8;
  uint uVar9;
  ulong uVar10;
  int v;
  uint local_38;
  
  if (7 < nVarsAll) {
    __assert_fail("nVarsAll <= 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                  ,0x223,"void If_Dec7MinimumBase(word *, int *, int, int *)");
  }
  uVar10 = 0;
  uVar3 = (ulong)(uint)nVarsAll;
  if (nVarsAll < 1) {
    uVar3 = uVar10;
  }
  pwVar8 = Truth6;
  iVar5 = 0;
  uVar9 = 0;
  do {
    if (uVar3 == uVar10) {
      if (pnVars != (int *)0x0) {
        *pnVars = iVar5;
      }
      if ((uVar9 + 1 & uVar9) != 0) {
        iVar4 = -1;
        iVar6 = 0;
        for (uVar7 = 0; local_38 = (uint)uVar3, uVar7 != local_38; uVar7 = uVar7 + 1) {
          v = iVar4;
          if ((uVar9 >> (uVar7 & 0x1f) & 1) != 0) {
            for (; iVar6 < v + 1; v = v + -1) {
              If_Dec7SwapAdjacent(uTruth,v);
            }
            iVar6 = iVar6 + 1;
          }
          iVar4 = iVar4 + 1;
        }
        if (iVar6 != iVar5) {
          __assert_fail("Var == nVars",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec07.c"
                        ,0x21e,"void If_Dec7TruthShrink(word *, int, int, unsigned int)");
        }
      }
      return;
    }
    uVar1 = *uTruth;
    if (uVar10 == 6) {
      if (uVar1 != uTruth[1]) {
LAB_00323815:
        uVar7 = 1 << ((byte)uVar10 & 0x1f);
LAB_0032381d:
        if (pSupp != (int *)0x0) {
          pSupp[iVar5] = pSupp[uVar10];
        }
        uVar9 = uVar9 | uVar7;
        iVar5 = iVar5 + 1;
      }
    }
    else {
      uVar2 = *pwVar8;
      uVar7 = 1 << ((byte)uVar10 & 0x1f);
      if ((uVar2 & uVar1) >> ((byte)uVar7 & 0x3f) != (uVar1 & ~uVar2)) goto LAB_0032381d;
      if ((uVar2 & uTruth[1]) >> ((byte)uVar7 & 0x3f) != (~uVar2 & uTruth[1])) goto LAB_00323815;
    }
    uVar10 = uVar10 + 1;
    pwVar8 = pwVar8 + 1;
  } while( true );
}

Assistant:

void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 7 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( If_Dec7HasVar( uTruth, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( If_DecSuppIsMinBase( uSupp ) )
        return;
    If_Dec7TruthShrink( uTruth, iVar, nVarsAll, uSupp );
}